

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadMicroStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,MicroString *str,Arena *arena)

{
  void *pvVar1;
  LargeRepKind LVar2;
  LargeRep *pLVar3;
  char *pcVar4;
  long lVar5;
  MicroRep *pMVar6;
  StringRep *r;
  Nonnull<const_char_*> pcVar7;
  anon_class_16_2_90f187bb invoke_setter;
  ulong local_70;
  anon_class_16_2_90f187bb local_68;
  anon_class_8_1_6b2701bd local_58;
  char *local_50;
  int local_44 [5];
  anon_class_24_3_c2b06966 local_30;
  
  local_30.ptr = &local_50;
  local_30.size = local_44;
  local_70 = (ulong)size;
  local_68.setter = &local_30;
  local_68.size = &local_70;
  pvVar1 = str->rep_;
  local_58.setter = local_68.setter;
  local_50 = ptr;
  local_44[0] = size;
  local_30.this = this;
  if (((ulong)pvVar1 & 3) == 0) {
    if (7 < (uint)size) goto LAB_002fc9ad;
LAB_002fca1d:
    pcVar4 = MicroString::inline_head(str);
    lVar5 = MicroString::
            SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
            ::anon_class_16_2_90f187bb::operator()(&local_68,pcVar4);
    if (0xff < (ulong)(lVar5 << 2)) {
      protobuf_assumption_failed
                ("size <= 0xFF",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
                 ,0x171);
    }
    str->rep_ = (void *)((ulong)str->rep_ & 0xffffffffffffff00 | lVar5 << 2);
  }
  else {
    if (((ulong)pvVar1 & 2) == 0) {
      if (((ulong)pvVar1 & 1) == 0) goto LAB_002fc9ad;
      LVar2 = MicroString::large_rep_kind(str);
      if (LVar2 != kString) {
        if ((LVar2 == kOwned) &&
           (pLVar3 = MicroString::large_rep(str), local_70 <= pLVar3->capacity)) {
          pcVar4 = MicroString::LargeRep::owned_head(pLVar3);
          lVar5 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()(&local_68,pcVar4);
          MicroString::LargeRep::owned_head(pLVar3);
          MicroString::LargeRep::owned_head(pLVar3);
          pLVar3->size = (uint32_t)lVar5;
          return local_50;
        }
        goto LAB_002fc9ad;
      }
      r = MicroString::string_rep(str);
    }
    else {
      pMVar6 = MicroString::micro_rep(str);
      if (local_70 <= pMVar6->capacity) {
        lVar5 = MicroString::
                SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                ::anon_class_16_2_90f187bb::operator()(&local_68,(char *)(pMVar6 + 1));
        pMVar6->size = (uint8_t)lVar5;
        return local_50;
      }
LAB_002fc9ad:
      if ((arena == (Arena *)0x0) && (((ulong)str->rep_ & 3) != 0)) {
        MicroString::DestroySlow(str);
      }
      if (local_70 < 8) {
        *(undefined1 *)&str->rep_ = 0;
        goto LAB_002fca1d;
      }
      if (local_70 < 0x100) {
        pMVar6 = MicroString::AllocateMicroRep(str,local_70,arena);
        if (pMVar6->capacity < local_70) {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_char>
                             (local_70,pMVar6->capacity,"size <= r->capacity");
        }
        else {
          pcVar7 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar7 == (Nonnull<const_char_*>)0x0) {
          lVar5 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()(&local_68,(char *)(pMVar6 + 1));
          pMVar6->size = (uint8_t)lVar5;
          return local_50;
        }
        ReadMicroStringFallback();
LAB_002fcb3f:
        ReadMicroStringFallback();
      }
      if (local_70 < 0x2faf081) {
        pLVar3 = MicroString::AllocateOwnedRep(str,local_70,arena);
        if (pLVar3->capacity < local_70) {
          pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                             (local_70,(ulong)pLVar3->capacity,"size <= r->capacity");
        }
        else {
          pcVar7 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar7 == (Nonnull<const_char_*>)0x0) {
          pcVar4 = MicroString::LargeRep::owned_head(pLVar3);
          lVar5 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()(&local_68,pcVar4);
          MicroString::LargeRep::owned_head(pLVar3);
          MicroString::LargeRep::owned_head(pLVar3);
          pLVar3->size = (uint32_t)lVar5;
          return local_50;
        }
        goto LAB_002fcb3f;
      }
      r = MicroString::AllocateStringRep(str,arena);
    }
    MicroString::
    SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
    ::anon_class_8_1_6b2701bd::operator()(&local_58,r);
  }
  return local_50;
}

Assistant:

const char* EpsCopyInputStream::ReadMicroStringFallback(const char* ptr,
                                                        int size,
                                                        MicroString& str,
                                                        Arena* arena) {
  str.SetInChunks(size, arena, [&](auto append) {
    ptr = AppendSize(ptr, size, [&](const char* p, int s) {
      append(absl::string_view(p, s));
    });
  });
  return ptr;
}